

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::makeAbsoluteTicks(MidiFile *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  reference ppMVar6;
  MidiEvent *pMVar7;
  int *timedata;
  int local_18;
  int length;
  int j;
  int i;
  MidiFile *this_local;
  
  iVar2 = getTickState(this);
  if (iVar2 != 1) {
    iVar2 = getNumTracks(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    for (length = 0; length < iVar2; length = length + 1) {
      *(undefined4 *)((long)pvVar5 + (long)length * 4) = 0;
      ppMVar6 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)length);
      iVar3 = MidiEventList::size(*ppMVar6);
      if (0 < iVar3) {
        ppMVar6 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)length);
        pMVar7 = MidiEventList::operator[](*ppMVar6,0);
        *(int *)((long)pvVar5 + (long)length * 4) = pMVar7->tick;
        local_18 = 1;
        while( true ) {
          ppMVar6 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)length);
          iVar3 = MidiEventList::size(*ppMVar6);
          if (iVar3 <= local_18) break;
          ppMVar6 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)length);
          pMVar7 = MidiEventList::operator[](*ppMVar6,local_18);
          *(int *)((long)pvVar5 + (long)length * 4) =
               pMVar7->tick + *(int *)((long)pvVar5 + (long)length * 4);
          iVar3 = *(int *)((long)pvVar5 + (long)length * 4);
          ppMVar6 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)length);
          pMVar7 = MidiEventList::operator[](*ppMVar6,local_18);
          pMVar7->tick = iVar3;
          local_18 = local_18 + 1;
        }
      }
    }
    this->m_theTimeState = 1;
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  return;
}

Assistant:

void MidiFile::makeAbsoluteTicks(void) {
	if (getTickState() == TIME_STATE_ABSOLUTE) {
		return;
	}
	int i, j;
	int length = getNumTracks();
	int* timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			timedata[i] += (*m_events[i])[j].tick;
			(*m_events[i])[j].tick = timedata[i];
		}
	}
	m_theTimeState = TIME_STATE_ABSOLUTE;
	delete [] timedata;
}